

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recv.c
# Opt level: O0

yrmcds_error yrmcds_recv(yrmcds *c,yrmcds_response *r)

{
  byte bVar1;
  char *pcVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  yrmcds_error yVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  size_t __n;
  uint64_t uVar8;
  ulong uVar9;
  char *local_60;
  char *local_58;
  char *pdata;
  size_t data_len;
  char *pkey;
  uint8_t extras_len;
  uint16_t key_len;
  yrmcds_error e_1;
  uint32_t total_len;
  yrmcds_error e;
  size_t remain;
  yrmcds_response *r_local;
  yrmcds *c_local;
  
  if ((c == (yrmcds *)0x0) || (r == (yrmcds_response *)0x0)) {
    return YRMCDS_BAD_ARGUMENT;
  }
  if (c->invalid != 0) {
    return YRMCDS_PROTOCOL_ERROR;
  }
  if (c->last_size != 0) {
    __n = c->used - c->last_size;
    if (__n != 0) {
      memmove(c->recvbuf,c->recvbuf + c->last_size,__n);
    }
    c->used = __n;
    c->last_size = 0;
    free(c->decompressed);
    c->decompressed = (char *)0x0;
  }
  if (c->text_mode != 0) {
    yVar5 = text_recv(c,r);
    return yVar5;
  }
  while (c->used < 0x18) {
    yVar5 = recv_data(c);
    if (yVar5 != YRMCDS_OK) {
      return yVar5;
    }
  }
  if (*c->recvbuf != -0x7f) {
    c->invalid = 1;
    return YRMCDS_PROTOCOL_ERROR;
  }
  uVar6 = ntoh32(c->recvbuf + 8);
  if (0x3200000 < uVar6) {
    c->invalid = 1;
    return YRMCDS_PROTOCOL_ERROR;
  }
  while (c->used < (ulong)uVar6 + 0x18) {
    yVar5 = recv_data(c);
    if (yVar5 != YRMCDS_OK) {
      return yVar5;
    }
  }
  uVar3 = ntoh16(c->recvbuf + 2);
  bVar1 = c->recvbuf[4];
  if (uVar6 < (uint)uVar3 + (uint)bVar1) {
    c->invalid = 1;
    return YRMCDS_PROTOCOL_ERROR;
  }
  pcVar2 = c->recvbuf;
  r->length = (ulong)uVar6 + 0x18;
  r->command = (uint)(byte)c->recvbuf[1];
  local_58 = pcVar2 + (ulong)bVar1 + 0x18;
  if (uVar3 == 0) {
    local_58 = (char *)0x0;
  }
  r->key = local_58;
  r->key_len = (ulong)uVar3;
  uVar4 = ntoh16(c->recvbuf + 6);
  r->status = (uint)uVar4;
  r->serial = *(uint32_t *)(c->recvbuf + 0xc);
  uVar8 = ntoh64(c->recvbuf + 0x10);
  r->cas_unique = uVar8;
  r->flags = 0;
  if (bVar1 != 0) {
    if (bVar1 != 4) {
      c->invalid = 1;
      return YRMCDS_PROTOCOL_ERROR;
    }
    uVar7 = ntoh32(c->recvbuf + 0x18);
    r->flags = uVar7;
  }
  uVar9 = (ulong)((uVar6 - uVar3) - (uint)bVar1);
  local_60 = pcVar2 + (ulong)bVar1 + 0x18 + (int)(uint)uVar3;
  if (((r->command == YRMCDS_CMD_INCREMENT) || (r->command == YRMCDS_CMD_DECREMENT)) &&
     (r->status == YRMCDS_STATUS_OK)) {
    r->data = (char *)0x0;
    r->data_len = 0;
    if (uVar9 != 8) {
      c->invalid = 1;
      return YRMCDS_PROTOCOL_ERROR;
    }
    uVar8 = ntoh64(local_60);
    r->value = uVar8;
    c->last_size = r->length;
    return YRMCDS_OK;
  }
  r->value = 0;
  if (uVar9 == 0) {
    local_60 = (char *)0x0;
  }
  r->data = local_60;
  r->data_len = uVar9;
  c->last_size = r->length;
  return YRMCDS_OK;
}

Assistant:

yrmcds_error yrmcds_recv(yrmcds* c, yrmcds_response* r) {
    if( c == NULL || r == NULL )
        return YRMCDS_BAD_ARGUMENT;
    if( c->invalid )
        return YRMCDS_PROTOCOL_ERROR;

    if( c->last_size > 0 ) {
        size_t remain = c->used - c->last_size;
        if( remain > 0 )
            memmove(c->recvbuf, c->recvbuf + c->last_size, remain);
        c->used = remain;
        c->last_size = 0;
        free(c->decompressed);
        c->decompressed = NULL;
    }

    if( c->text_mode ) {
        return text_recv(c, r);
    }

    while( c->used < BINARY_HEADER_SIZE ) {
        yrmcds_error e = recv_data(c);
        if( e != 0 ) return e;
    }

    if( *c->recvbuf != '\x81' ) {
        c->invalid = 1;
        return YRMCDS_PROTOCOL_ERROR;
    }
    uint32_t total_len = ntoh32(c->recvbuf + 8);
    if( total_len > MAX_CAPACITY ) {
        c->invalid = 1;
        return YRMCDS_PROTOCOL_ERROR;
    }
    while( c->used < (BINARY_HEADER_SIZE + total_len) ) {
        yrmcds_error e = recv_data(c);
        if( e != 0 ) return e;
    }

    uint16_t key_len = ntoh16(c->recvbuf + 2);
    uint8_t extras_len = *(unsigned char*)(c->recvbuf + 4);
    if( total_len < (key_len + extras_len) ) {
        c->invalid = 1;
        return YRMCDS_PROTOCOL_ERROR;
    }

    const char* pkey = c->recvbuf + (BINARY_HEADER_SIZE + extras_len);
    r->length = BINARY_HEADER_SIZE + total_len;
    r->command = *(unsigned char*)(c->recvbuf + 1);
    r->key = key_len ? pkey : NULL;
    r->key_len = key_len;
    r->status = ntoh16(c->recvbuf + 6);
    memcpy(&(r->serial), c->recvbuf + 12, 4);
    r->cas_unique = ntoh64(c->recvbuf + 16);
    r->flags = 0;
    if( extras_len > 0 ) {
        if( extras_len != 4 ) {
            c->invalid = 1;
            return YRMCDS_PROTOCOL_ERROR;
        }
        r->flags = ntoh32(c->recvbuf + BINARY_HEADER_SIZE);
    }

    size_t data_len = total_len - key_len - extras_len;
    const char* pdata = pkey + key_len;

    if( (r->command == YRMCDS_CMD_INCREMENT ||
         r->command == YRMCDS_CMD_DECREMENT) &&
        (r->status == YRMCDS_STATUS_OK) ) {
        r->data = NULL;
        r->data_len = 0;
        if( data_len != 8 ) {
            c->invalid = 1;
            return YRMCDS_PROTOCOL_ERROR;
        }
        r->value = ntoh64(pdata);
        c->last_size = r->length;
        return YRMCDS_OK;
    }
    r->value = 0;
    r->data = data_len ? pdata : NULL;
    r->data_len = data_len;

#ifdef LIBYRMCDS_USE_LZ4
    if( c->compress_size && (r->flags & YRMCDS_FLAG_COMPRESS) ) {
        if( data_len == 0 ) {
            c->invalid = 1;
            return YRMCDS_PROTOCOL_ERROR;
        }
        r->flags &= ~(uint32_t)YRMCDS_FLAG_COMPRESS;
        uint32_t decompress_size = ntoh32(pdata);
        if( UINT32_MAX > INT_MAX ) {
            if( decompress_size > INT_MAX ) {
                c->invalid = 1;
                return YRMCDS_PROTOCOL_ERROR;
            }
        }
        c->decompressed = (char*)malloc(decompress_size);
        if( c->decompressed == NULL )
            return YRMCDS_OUT_OF_MEMORY;
        int d = LZ4_decompress_safe(pdata + sizeof(uint32_t),
                                    c->decompressed,
                                    (int)(data_len - sizeof(uint32_t)),
                                    (int)decompress_size);
        if( d != decompress_size ) {
            c->invalid = 1;
            return YRMCDS_PROTOCOL_ERROR;
        }
        r->data = c->decompressed;
        r->data_len = decompress_size;
    }
#endif // LIBYRMCDS_USE_LZ4

    c->last_size = r->length;
    return YRMCDS_OK;
}